

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O2

string * __thiscall
spvtools::val::(anonymous_namespace)::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,CapabilitySet *capabilities,
          AssemblyGrammar *grammar)

{
  long lVar1;
  long lVar2;
  Capability operand;
  spv_result_t sVar3;
  ostream *poVar4;
  CapabilitySet *__range2;
  spv_operand_desc desc;
  iterator __begin2;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  EnumSet<spv::Capability>::cbegin(&__begin2,(EnumSet<spv::Capability> *)this);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)this;
  while (((__begin2.set_ != (EnumSet<spv::Capability> *)this || (__begin2.bucketOffset_ != 0)) ||
         (__begin2.bucketIndex_ != lVar1 - lVar2 >> 4))) {
    operand = EnumSet<spv::Capability>::Iterator::operator*(&__begin2);
    sVar3 = AssemblyGrammar::lookupOperand
                      ((AssemblyGrammar *)capabilities,SPV_OPERAND_TYPE_CAPABILITY,operand,&desc);
    if (sVar3 == SPV_SUCCESS) {
      poVar4 = std::operator<<(local_1a8,desc->name);
    }
    else {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    }
    std::operator<<(poVar4," ");
    EnumSet<spv::Capability>::Iterator::operator++(&__begin2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const CapabilitySet& capabilities,
                     const AssemblyGrammar& grammar) {
  std::stringstream ss;
  for (auto capability : capabilities) {
    spv_operand_desc desc;
    if (SPV_SUCCESS == grammar.lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                             uint32_t(capability), &desc))
      ss << desc->name << " ";
    else
      ss << uint32_t(capability) << " ";
  }
  return ss.str();
}